

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs_signal.cpp
# Opt level: O2

void __thiscall CsSignal::SignalBase::~SignalBase(SignalBase *this)

{
  ~SignalBase(this);
  operator_delete(this,0x58);
  return;
}

Assistant:

CsSignal::SignalBase::~SignalBase()
{
   try {
      auto senderListHandle = m_connectList.lock_read();

      if (m_activateBusy > 0)  {
         // activate() called a slot which then destroys this sender
         std::lock_guard<std::mutex> lock(get_mutex_beingDestroyed());
         get_beingDestroyed().insert(this);
      }

      for (auto &item : *senderListHandle) {
         const SlotBase *receiver = item.receiver;

         if (receiver != nullptr) {
            auto receiverListHandle = receiver->m_possibleSenders.lock_write();

            auto iter = receiverListHandle->begin();

            while (iter != receiverListHandle->end())   {

               if (*iter == this) {
                  iter = receiverListHandle->erase(iter);
               } else {
                  ++iter;
               }

            }
         }
      }

   } catch (...) {
     // least of the worst options
     std::terminate();
   }
}